

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnicodeTextUsage.cpp
# Opt level: O3

int UnicodeTextUsage(int argc,char **argv)

{
  pointer pcVar1;
  EStatusCode EVar2;
  EncryptionOptions *pEVar3;
  PDFPage *this;
  PageContentContext *inPageContext;
  PDFUsedFont *inFontReference;
  _List_node_base *p_Var4;
  long lVar5;
  int iVar6;
  char *pcVar7;
  StringOrDoubleList textAndPos;
  PDFWriter pdfWriter;
  undefined1 local_1080 [8];
  _List_node_base *local_1078;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1070;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1060;
  _Alloc_hider local_1048;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1038;
  string local_1020;
  undefined1 local_1000 [16];
  undefined1 local_ff0 [8];
  undefined1 local_fe8 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_fc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_fb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f90;
  string local_f70;
  string local_f50;
  undefined1 local_f30 [8];
  _Alloc_hider local_f28;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f18;
  longlong local_f08;
  _Alloc_hider local_f00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_ef0;
  PDFWriter local_ee0;
  
  PDFWriter::PDFWriter(&local_ee0);
  local_1020._M_dataplus._M_p = (pointer)&local_1020.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1020,"UnicodeTextUsage.pdf","");
  BuildRelativeOutputPath((string *)(local_fe8 + 0x18),(char **)argv[2],&local_1020);
  local_f70._M_dataplus._M_p = (pointer)&local_f70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f70,"UnicodeTextUsage.log","");
  BuildRelativeOutputPath(&local_f50,(char **)argv[2],&local_f70);
  LogConfiguration::LogConfiguration((LogConfiguration *)local_1000,true,true,&local_f50);
  pEVar3 = EncryptionOptions::DefaultEncryptionOptions();
  local_f30[0] = pEVar3->ShouldEncrypt;
  pcVar1 = (pEVar3->UserPassword)._M_dataplus._M_p;
  local_f28._M_p = (pointer)&local_f18;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f28,pcVar1,pcVar1 + (pEVar3->UserPassword)._M_string_length);
  local_f08 = pEVar3->UserProtectionOptionsFlag;
  pcVar1 = (pEVar3->OwnerPassword)._M_dataplus._M_p;
  local_f00._M_p = (pointer)&local_ef0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f00,pcVar1,pcVar1 + (pEVar3->OwnerPassword)._M_string_length);
  PDFCreationSettings::PDFCreationSettings
            ((PDFCreationSettings *)local_1080,true,true,(EncryptionOptions *)local_f30,false);
  EVar2 = PDFWriter::StartPDF(&local_ee0,(string *)(local_fe8 + 0x18),ePDFVersion13,
                              (LogConfiguration *)local_1000,(PDFCreationSettings *)local_1080);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1048._M_p != &local_1038) {
    operator_delete(local_1048._M_p,local_1038._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_1070._M_allocated_capacity._1_7_,local_1070._M_local_buf[0]) != &local_1060)
  {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_1070._M_allocated_capacity._1_7_,local_1070._M_local_buf[0]),
                    (ulong)(local_1060._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f00._M_p != &local_ef0) {
    operator_delete(local_f00._M_p,local_ef0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f28._M_p != &local_f18) {
    operator_delete(local_f28._M_p,local_f18._M_allocated_capacity + 1);
  }
  if ((string *)local_1000._8_8_ != (string *)local_fe8) {
    operator_delete((void *)local_1000._8_8_,local_fe8._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f50._M_dataplus._M_p != &local_f50.field_2) {
    operator_delete(local_f50._M_dataplus._M_p,local_f50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f70._M_dataplus._M_p != &local_f70.field_2) {
    operator_delete(local_f70._M_dataplus._M_p,local_f70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_fe8._24_8_ != &local_fc0) {
    operator_delete((void *)local_fe8._24_8_,local_fc0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1020._M_dataplus._M_p != &local_1020.field_2) {
    operator_delete(local_1020._M_dataplus._M_p,local_1020.field_2._M_allocated_capacity + 1);
  }
  if (EVar2 != eSuccess) {
    iVar6 = 1;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"failed to start PDF\n",0x14);
    goto LAB_0018eece;
  }
  this = (PDFPage *)operator_new(0x2b8);
  PDFPage::PDFPage(this);
  PDFRectangle::PDFRectangle((PDFRectangle *)local_1080,0.0,0.0,595.0,842.0);
  PDFPage::SetMediaBox(this,(PDFRectangle *)local_1080);
  PDFRectangle::~PDFRectangle((PDFRectangle *)local_1080);
  inPageContext = PDFWriter::StartPageContentContext(&local_ee0,this);
  if (inPageContext == (PageContentContext *)0x0) {
    iVar6 = 1;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"failed to create content context for page\n",0x2a);
    goto LAB_0018eece;
  }
  local_1020._M_dataplus._M_p = (pointer)&local_1020.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1020,"fonts/arial.ttf","");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1000,argv[1],(allocator<char> *)&local_f50);
  LocalPathToFileURL((FileURL *)local_1080,(string *)local_1000);
  RelativeURLToLocalPath((string *)(local_fe8 + 0x18),(FileURL *)local_1080,&local_1020);
  FileURL::~FileURL((FileURL *)local_1080);
  if ((string *)local_1000._0_8_ != (string *)local_ff0) {
    operator_delete((void *)local_1000._0_8_,(long)local_ff0 + 1);
  }
  inFontReference = PDFWriter::GetFontForFile(&local_ee0,(string *)(local_fe8 + 0x18),0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_fe8._24_8_ != &local_fc0) {
    operator_delete((void *)local_fe8._24_8_,local_fc0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1020._M_dataplus._M_p != &local_1020.field_2) {
    operator_delete(local_1020._M_dataplus._M_p,local_1020.field_2._M_allocated_capacity + 1);
  }
  if (inFontReference == (PDFUsedFont *)0x0) {
    iVar6 = 1;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Failed to create font object for arial.ttf\n",0x2b);
    goto LAB_0018eece;
  }
  AbstractContentContext::BT(&inPageContext->super_AbstractContentContext);
  AbstractContentContext::k(&inPageContext->super_AbstractContentContext,0.0,0.0,0.0,1.0);
  AbstractContentContext::Tf(&inPageContext->super_AbstractContentContext,inFontReference,1.0);
  AbstractContentContext::Tm
            (&inPageContext->super_AbstractContentContext,30.0,0.0,0.0,30.0,78.4252,662.8997);
  local_1080 = (undefined1  [8])&local_1070;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1080,anon_var_dwarf_32f495,anon_var_dwarf_32f495 + 8);
  EVar2 = AbstractContentContext::Tj
                    (&inPageContext->super_AbstractContentContext,(string *)local_1080);
  if (local_1080 != (undefined1  [8])&local_1070) {
    operator_delete((void *)local_1080,
                    CONCAT71(local_1070._M_allocated_capacity._1_7_,local_1070._M_local_buf[0]) + 1)
    ;
  }
  if (EVar2 != eSuccess) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Could not find some of the glyphs for this font Tj",0x32);
  }
  AbstractContentContext::Tm
            (&inPageContext->super_AbstractContentContext,30.0,0.0,0.0,30.0,78.4252,562.8997);
  local_ff0 = (undefined1  [8])0x0;
  local_1000._0_8_ = (string *)local_1000;
  local_1000._8_8_ = (string *)local_1000;
  local_f90._M_dataplus._M_p = (pointer)&local_f90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f90,"hell","");
  SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::SomethingOrDouble((SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_1080,&local_f90);
  p_Var4 = (_List_node_base *)operator_new(0x40);
  p_Var4[1]._M_next = p_Var4 + 2;
  if (local_1080 == (undefined1  [8])&local_1070) {
    p_Var4[2]._M_next =
         (_List_node_base *)
         CONCAT71(local_1070._M_allocated_capacity._1_7_,local_1070._M_local_buf[0]);
    p_Var4[2]._M_prev = (_List_node_base *)local_1070._8_8_;
  }
  else {
    p_Var4[1]._M_next = (_List_node_base *)local_1080;
    p_Var4[2]._M_next =
         (_List_node_base *)
         CONCAT71(local_1070._M_allocated_capacity._1_7_,local_1070._M_local_buf[0]);
  }
  p_Var4[1]._M_prev = local_1078;
  local_1078 = (_List_node_base *)0x0;
  local_1070._M_local_buf[0] = '\0';
  *(char *)&p_Var4[3]._M_prev = local_1060._M_local_buf[8];
  p_Var4[3]._M_next = (_List_node_base *)local_1060._M_allocated_capacity;
  local_1080 = (undefined1  [8])&local_1070;
  std::__detail::_List_node_base::_M_hook(p_Var4);
  local_ff0 = (undefined1  [8])((long)local_ff0 + 1);
  if (local_1080 != (undefined1  [8])&local_1070) {
    operator_delete((void *)local_1080,
                    CONCAT71(local_1070._M_allocated_capacity._1_7_,local_1070._M_local_buf[0]) + 1)
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f90._M_dataplus._M_p != &local_f90.field_2) {
    operator_delete(local_f90._M_dataplus._M_p,local_f90.field_2._M_allocated_capacity + 1);
  }
  local_1078 = (_List_node_base *)0x0;
  local_1070._M_local_buf[0] = '\0';
  local_1060._M_allocated_capacity = 0xc097700000000000;
  local_1060._M_local_buf[8] = '\x01';
  local_1080 = (undefined1  [8])&local_1070;
  p_Var4 = (_List_node_base *)operator_new(0x40);
  p_Var4[1]._M_next = p_Var4 + 2;
  if (local_1080 == (undefined1  [8])&local_1070) {
    p_Var4[2]._M_next =
         (_List_node_base *)
         CONCAT71(local_1070._M_allocated_capacity._1_7_,local_1070._M_local_buf[0]);
    p_Var4[2]._M_prev = (_List_node_base *)local_1070._8_8_;
  }
  else {
    p_Var4[1]._M_next = (_List_node_base *)local_1080;
    p_Var4[2]._M_next =
         (_List_node_base *)
         CONCAT71(local_1070._M_allocated_capacity._1_7_,local_1070._M_local_buf[0]);
  }
  p_Var4[1]._M_prev = local_1078;
  local_1078 = (_List_node_base *)0x0;
  local_1070._M_local_buf[0] = '\0';
  *(char *)&p_Var4[3]._M_prev = local_1060._M_local_buf[8];
  p_Var4[3]._M_next = (_List_node_base *)local_1060._M_allocated_capacity;
  local_1080 = (undefined1  [8])&local_1070;
  std::__detail::_List_node_base::_M_hook(p_Var4);
  local_ff0 = (undefined1  [8])((long)local_ff0 + 1);
  if (local_1080 != (undefined1  [8])&local_1070) {
    operator_delete((void *)local_1080,
                    CONCAT71(local_1070._M_allocated_capacity._1_7_,local_1070._M_local_buf[0]) + 1)
    ;
  }
  local_fb0._M_dataplus._M_p = (pointer)&local_fb0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_fb0,anon_var_dwarf_32f495 + 4,anon_var_dwarf_32f495 + 8);
  SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::SomethingOrDouble((SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_1080,&local_fb0);
  p_Var4 = (_List_node_base *)operator_new(0x40);
  p_Var4[1]._M_next = p_Var4 + 2;
  if (local_1080 == (undefined1  [8])&local_1070) {
    p_Var4[2]._M_next =
         (_List_node_base *)
         CONCAT71(local_1070._M_allocated_capacity._1_7_,local_1070._M_local_buf[0]);
    p_Var4[2]._M_prev = (_List_node_base *)local_1070._8_8_;
  }
  else {
    p_Var4[1]._M_next = (_List_node_base *)local_1080;
    p_Var4[2]._M_next =
         (_List_node_base *)
         CONCAT71(local_1070._M_allocated_capacity._1_7_,local_1070._M_local_buf[0]);
  }
  p_Var4[1]._M_prev = local_1078;
  local_1078 = (_List_node_base *)0x0;
  local_1070._M_local_buf[0] = '\0';
  *(char *)&p_Var4[3]._M_prev = local_1060._M_local_buf[8];
  p_Var4[3]._M_next = (_List_node_base *)local_1060._M_allocated_capacity;
  local_1080 = (undefined1  [8])&local_1070;
  std::__detail::_List_node_base::_M_hook(p_Var4);
  local_ff0 = (undefined1  [8])((long)local_ff0 + 1);
  if (local_1080 != (undefined1  [8])&local_1070) {
    operator_delete((void *)local_1080,
                    CONCAT71(local_1070._M_allocated_capacity._1_7_,local_1070._M_local_buf[0]) + 1)
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_fb0._M_dataplus._M_p != &local_fb0.field_2) {
    operator_delete(local_fb0._M_dataplus._M_p,local_fb0.field_2._M_allocated_capacity + 1);
  }
  EVar2 = AbstractContentContext::TJ
                    (&inPageContext->super_AbstractContentContext,(StringOrDoubleList *)local_1000);
  if (EVar2 != eSuccess) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Could not find some of the glyphs for this font using TJ",0x38
              );
  }
  AbstractContentContext::ET(&inPageContext->super_AbstractContentContext);
  EVar2 = PDFWriter::EndPageContentContext(&local_ee0,inPageContext);
  if (EVar2 == eSuccess) {
    EVar2 = PDFWriter::WritePageAndRelease(&local_ee0,this);
    if (EVar2 != eSuccess) {
      lVar5 = 0x15;
      pcVar7 = "failed to write page\n";
      goto LAB_0018f4a4;
    }
    EVar2 = PDFWriter::EndPDF(&local_ee0);
    if (EVar2 != eSuccess) {
      lVar5 = 0x12;
      pcVar7 = "failed in end PDF\n";
      goto LAB_0018f4a4;
    }
    iVar6 = 0;
  }
  else {
    lVar5 = 0x23;
    pcVar7 = "failed to end page content context\n";
LAB_0018f4a4:
    iVar6 = 1;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar7,lVar5);
  }
  std::__cxx11::
  _List_base<SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_M_clear((_List_base<SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_1000);
LAB_0018eece:
  PDFWriter::~PDFWriter(&local_ee0);
  return iVar6;
}

Assistant:

int UnicodeTextUsage(int argc, char* argv[])
{
	PDFWriter pdfWriter;
	EStatusCode status;

	do
	{
		status = pdfWriter.StartPDF(
			BuildRelativeOutputPath(argv,"UnicodeTextUsage.pdf"),
			ePDFVersion13,
			LogConfiguration(true, true, BuildRelativeOutputPath(argv,"UnicodeTextUsage.log")));
		if (status != PDFHummus::eSuccess)
		{
			cout << "failed to start PDF\n";
			break;
		}

		PDFPage* page = new PDFPage();
		page->SetMediaBox(PDFRectangle(0, 0, 595, 842));

		PageContentContext* contentContext = pdfWriter.StartPageContentContext(page);
		if (NULL == contentContext)
		{
			status = PDFHummus::eFailure;
			cout << "failed to create content context for page\n";
			break;
		}

		PDFUsedFont* font = pdfWriter.GetFontForFile(
			BuildRelativeInputPath(argv,"fonts/arial.ttf"));
		if (!font)
		{
			status = PDFHummus::eFailure;
			cout << "Failed to create font object for arial.ttf\n";
			break;
		}


		// Draw some text
		contentContext->BT();
		contentContext->k(0, 0, 0, 1);

		contentContext->Tf(font, 1);

		contentContext->Tm(30, 0, 0, 30, 78.4252, 662.8997);

		EStatusCode encodingStatus = contentContext->Tj("hello \xD7\x92");
		if (encodingStatus != PDFHummus::eSuccess)
			cout << "Could not find some of the glyphs for this font Tj";

		contentContext->Tm(30, 0, 0, 30, 78.4252, 562.8997);
		StringOrDoubleList textAndPos;

		textAndPos.push_back(StringOrDouble("hell"));
		textAndPos.push_back(-50*30);
		textAndPos.push_back(StringOrDouble("o \xD7\x92"));

		encodingStatus = contentContext->TJ(textAndPos);
		if (encodingStatus != PDFHummus::eSuccess)
			cout << "Could not find some of the glyphs for this font using TJ";


		// continue even if failed...want to see how it looks like
		contentContext->ET();

		status = pdfWriter.EndPageContentContext(contentContext);
		if (status != PDFHummus::eSuccess)
		{
			cout << "failed to end page content context\n";
			break;
		}

		status = pdfWriter.WritePageAndRelease(page);
		if (status != PDFHummus::eSuccess)
		{
			cout << "failed to write page\n";
			break;
		}

		status = pdfWriter.EndPDF();
		if (status != PDFHummus::eSuccess)
		{
			cout << "failed in end PDF\n";
			break;
		}
	} while (false);
	return status == eSuccess ? 0:1;
}